

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gamecontext.cpp
# Opt level: O2

void __thiscall CGameContext::SendTuningParams(CGameContext *this,int ClientID)

{
  long lVar1;
  uint i;
  long lVar2;
  long in_FS_OFFSET;
  CMsgPacker Msg;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  CheckPureTuning(this);
  CMsgPacker::CMsgPacker((CMsgPacker *)&Msg.super_CPacker,6,false);
  for (lVar2 = 0; lVar2 != 0x20; lVar2 = lVar2 + 1) {
    CPacker::AddInt(&Msg.super_CPacker,(&(this->m_Tuning).m_GroundControlSpeed)[lVar2].m_Value);
  }
  (*(this->m_pServer->super_IInterface)._vptr_IInterface[9])(this->m_pServer,&Msg,1,ClientID);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void CGameContext::SendTuningParams(int ClientID)
{
	CheckPureTuning();

	CMsgPacker Msg(NETMSGTYPE_SV_TUNEPARAMS);
	int *pParams = (int *)&m_Tuning;
	for(unsigned i = 0; i < sizeof(m_Tuning)/sizeof(int); i++)
		Msg.AddInt(pParams[i]);
	Server()->SendMsg(&Msg, MSGFLAG_VITAL, ClientID);
}